

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateImplMemberInit
          (MessageGenerator *this,Printer *p,InitType init_type)

{
  Printer *this_00;
  bool bVar1;
  LogMessage *pLVar2;
  optional<unsigned_long> indent_00;
  undefined1 local_198 [8];
  anon_class_32_4_75009029 init_weak_field_map;
  anon_class_32_4_76007961 init_oneof_cases;
  anon_class_24_3_1e7e7f3e init_cached_size_if_no_hasbits;
  anon_class_24_3_1e7e7f3e init_oneofs;
  anon_class_24_3_1e7e7f3e init_split;
  anon_class_32_4_75009029 init_fields;
  anon_class_32_4_75009029 init_has_bits;
  anon_class_24_3_31679c88 init_inlined_string_indices;
  anon_class_32_4_75009029 init_extensions;
  MemberInitSeparator separator;
  undefined1 local_80 [12];
  undefined1 local_70 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:578:30)>
  indent;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [19];
  Voidify local_1d;
  undefined1 local_1c [8];
  InitType init_type_local;
  Printer *p_local;
  MessageGenerator *this_local;
  
  local_1c._0_4_ = init_type;
  unique0x100003fa = p;
  p_local = (Printer *)this;
  bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  this_00 = stack0xffffffffffffffe8;
  if (!bVar1) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)local_80);
    indent_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._12_4_ = 0;
    indent_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload =
         (_Storage<unsigned_long,_true>)local_80._0_8_;
    indent_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_80[8];
    indent_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_3_ = local_80._9_3_;
    io::Printer::WithIndent
              ((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:578:30)>
                *)local_70,this_00,indent_00);
    anon_unknown_0::MemberInitSeparator::MemberInitSeparator
              ((MemberInitSeparator *)&init_extensions.p,stack0xffffffffffffffe8);
    init_weak_field_map.this = (MessageGenerator *)local_1c;
    init_weak_field_map.init_type = (InitType *)&init_extensions.p;
    init_weak_field_map.separator = (MemberInitSeparator *)(local_1c + 4);
    local_198 = (undefined1  [8])this;
    init_weak_field_map.p = (Printer **)this;
    init_oneof_cases.this = (MessageGenerator *)init_weak_field_map.init_type;
    init_oneof_cases.separator = (MemberInitSeparator *)init_weak_field_map.this;
    init_oneof_cases.init_type = (InitType *)init_weak_field_map.separator;
    init_oneof_cases.p = (Printer **)this;
    init_cached_size_if_no_hasbits.this = (MessageGenerator *)init_weak_field_map.init_type;
    init_cached_size_if_no_hasbits.separator = init_weak_field_map.separator;
    init_cached_size_if_no_hasbits.p = (Printer **)this;
    init_oneofs.this = (MessageGenerator *)init_weak_field_map.init_type;
    init_oneofs.separator = init_weak_field_map.separator;
    init_oneofs.p = (Printer **)this;
    init_split.this = (MessageGenerator *)init_weak_field_map.init_type;
    init_split.separator = init_weak_field_map.separator;
    init_split.p = (Printer **)this;
    init_fields.this = init_weak_field_map.this;
    init_fields.init_type = init_weak_field_map.init_type;
    init_fields.separator = init_weak_field_map.separator;
    init_fields.p = (Printer **)this;
    init_has_bits.this = init_weak_field_map.this;
    init_has_bits.init_type = init_weak_field_map.init_type;
    init_has_bits.separator = init_weak_field_map.separator;
    init_has_bits.p = (Printer **)this;
    init_inlined_string_indices.this = (MessageGenerator *)init_weak_field_map.separator;
    init_inlined_string_indices.p = (Printer **)init_weak_field_map.init_type;
    init_inlined_string_indices.separator = (MemberInitSeparator *)this;
    init_extensions.this = init_weak_field_map.this;
    init_extensions.init_type = init_weak_field_map.init_type;
    init_extensions.separator = init_weak_field_map.separator;
    GenerateImplMemberInit::anon_class_32_4_75009029::operator()
              ((anon_class_32_4_75009029 *)&init_inlined_string_indices.separator);
    GenerateImplMemberInit::anon_class_24_3_31679c88::operator()
              ((anon_class_24_3_31679c88 *)&init_has_bits.p);
    GenerateImplMemberInit::anon_class_32_4_75009029::operator()
              ((anon_class_32_4_75009029 *)&init_fields.p);
    GenerateImplMemberInit::anon_class_32_4_75009029::operator()
              ((anon_class_32_4_75009029 *)&init_split.p);
    GenerateImplMemberInit::anon_class_24_3_1e7e7f3e::operator()
              ((anon_class_24_3_1e7e7f3e *)&init_oneofs.p);
    GenerateImplMemberInit::anon_class_24_3_1e7e7f3e::operator()
              ((anon_class_24_3_1e7e7f3e *)&init_cached_size_if_no_hasbits.p);
    GenerateImplMemberInit::anon_class_24_3_1e7e7f3e::operator()
              ((anon_class_24_3_1e7e7f3e *)&init_oneof_cases.p);
    GenerateImplMemberInit::anon_class_32_4_76007961::operator()
              ((anon_class_32_4_76007961 *)&init_weak_field_map.p);
    GenerateImplMemberInit::anon_class_32_4_75009029::operator()
              ((anon_class_32_4_75009029 *)local_198);
    anon_unknown_0::MemberInitSeparator::~MemberInitSeparator
              ((MemberInitSeparator *)&init_extensions.p);
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/printer.h:578:30)>
    ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_io_printer_h:578:30)>
                *)local_70);
    return;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"!HasSimpleBaseClass(descriptor_, options_)");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
             ,0xa7b,local_40._M_len,local_40._M_str);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_1d,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

void MessageGenerator::GenerateImplMemberInit(io::Printer* p,
                                              InitType init_type) {
  ABSL_DCHECK(!HasSimpleBaseClass(descriptor_, options_));

  auto indent = p->WithIndent();
  MemberInitSeparator separator(p);

  auto init_extensions = [&] {
    if (descriptor_->extension_range_count() > 0 &&
        init_type != InitType::kConstexpr) {
      separator();
      p->Emit("_extensions_{visibility, arena}");
    }
  };

  auto init_inlined_string_indices = [&] {
    if (!inlined_string_indices_.empty()) {
      bool dtor_on_demand = NeedsArenaDestructor() == ArenaDtorNeeds::kOnDemand;
      auto values = [&] {
        for (size_t i = 0; i < InlinedStringDonatedSize(); ++i) {
          if (i > 0) {
            p->Emit(", ");
          }
          p->Emit(dtor_on_demand
                      ? "::_pbi::InitDonatingStates()"
                      : "::_pbi::InitDonatingStates() & 0xFFFFFFFEu");
        }
      };
      separator();
      p->Emit({{"values", values}}, "_inlined_string_donated_{$values$}");
    }
  };

  auto init_has_bits = [&] {
    if (!has_bit_indices_.empty()) {
      if (init_type == InitType::kArenaCopy) {
        separator();
        p->Emit("_has_bits_{from._has_bits_}");
      }
      separator();
      p->Emit("_cached_size_{0}");
    }
  };

  auto init_fields = [&] {
    for (auto* field : optimized_order_) {
      if (ShouldSplit(field, options_)) continue;

      auto const& generator = field_generators_.get(field);
      switch (init_type) {
        case InitType::kConstexpr:
          separator();
          generator.GenerateMemberConstexprConstructor(p);
          break;
        case InitType::kArena:
          if (!generator.has_trivial_zero_default()) {
            separator();
            generator.GenerateMemberConstructor(p);
          }
          break;
        case InitType::kArenaCopy:
          if (!generator.has_trivial_value()) {
            separator();
            generator.GenerateMemberCopyConstructor(p);
          }
          break;
      }
    }
  };

  auto init_split = [&] {
    if (ShouldSplit(descriptor_, options_)) {
      separator();
      p->Emit({{"name", DefaultInstanceName(descriptor_, options_, true)}},
              "_split_{const_cast<Split*>(&$name$._instance)}");
    }
  };

  auto init_oneofs = [&] {
    for (auto oneof : OneOfRange(descriptor_)) {
      separator();
      p->Emit({{"name", oneof->name()}}, "$name$_{}");
    }
  };

  auto init_cached_size_if_no_hasbits = [&] {
    if (has_bit_indices_.empty()) {
      separator();
      p->Emit("_cached_size_{0}");
    }
  };

  auto init_oneof_cases = [&] {
    if (int count = descriptor_->real_oneof_decl_count()) {
      separator();
      if (init_type == InitType::kArenaCopy) {
        auto cases = [&] {
          for (int i = 0; i < count; ++i) {
            p->Emit({{"index", i}, {"comma", i ? ", " : ""}},
                    "$comma$from._oneof_case_[$index$]");
          }
        };
        p->Emit({{"cases", cases}}, "_oneof_case_{$cases$}");
      } else {
        p->Emit("_oneof_case_{}");
      }
    }
  };

  auto init_weak_field_map = [&] {
    if (num_weak_fields_ && init_type != InitType::kConstexpr) {
      separator();
      if (init_type == InitType::kArenaCopy) {
        p->Emit("_weak_field_map_{visibility, arena, from._weak_field_map_}");
      } else {
        p->Emit("_weak_field_map_{visibility, arena}");
      }
    }
  };

  // Initialization order of the various fields inside `_impl_(...)`
  init_extensions();
  init_inlined_string_indices();
  init_has_bits();
  init_fields();
  init_split();
  init_oneofs();
  init_cached_size_if_no_hasbits();
  init_oneof_cases();
  init_weak_field_map();
}